

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolDefinitionInlining.cpp
# Opt level: O3

void __thiscall
SymbolDefinitionInlining::collectBoundVariables(SymbolDefinitionInlining *this,Formula *formula)

{
  uint uVar1;
  Formula *formula_00;
  long lVar2;
  VList *pVVar3;
  Term *t;
  VList *pVVar4;
  undefined8 *puVar5;
  uint *puVar6;
  
  for (; formula->_connective - IMP < 3;
      formula = *(Formula **)((long)&formula->_connective + lVar2)) {
    collectBoundVariables(this,*(Formula **)(formula + 1));
    lVar2 = 0x30;
switchD_007ca896_caseD_6:
  }
  lVar2 = 0x28;
  switch(formula->_connective) {
  case LITERAL:
    t = *(Term **)(formula + 1);
LAB_007ca916:
    collectBoundVariables(this,t);
    return;
  case AND:
  case OR:
    puVar5 = *(undefined8 **)(formula + 1);
    while (puVar5 != (undefined8 *)0x0) {
      formula_00 = (Formula *)*puVar5;
      puVar5 = (undefined8 *)puVar5[1];
      collectBoundVariables(this,formula_00);
    }
    return;
  default:
    return;
  case NOT:
    goto switchD_007ca896_caseD_6;
  case FORALL:
  case EXISTS:
    collectBoundVariables(this,(Formula *)formula[1]._label._M_string_length);
    puVar6 = *(uint **)(formula + 1);
    if (puVar6 != (uint *)0x0) {
      pVVar4 = this->_bound;
      do {
        uVar1 = *puVar6;
        puVar6 = *(uint **)(puVar6 + 2);
        pVVar3 = (VList *)Lib::FixedSizeAllocator<16UL>::alloc
                                    ((FixedSizeAllocator<16UL> *)
                                     (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
        pVVar3->_head = uVar1;
        pVVar3->_tail = pVVar4;
        this->_bound = pVVar3;
        pVVar4 = pVVar3;
      } while (puVar6 != (uint *)0x0);
      return;
    }
    return;
  case BOOL_TERM:
    t = *(Term **)(formula + 1);
    if (((ulong)t & 1) != 0) {
      return;
    }
    goto LAB_007ca916;
  }
}

Assistant:

void SymbolDefinitionInlining::collectBoundVariables(Formula* formula) {
  switch (formula->connective()) {
    case FORALL:
    case EXISTS: {
      collectBoundVariables(formula->qarg());
      VList::Iterator vit(formula->vars());
      VList::pushFromIterator(vit, _bound);
      break;
    }

    case AND:
    case OR: {
      List<Formula*>::Iterator fit(formula->args());
      while (fit.hasNext()) {
        collectBoundVariables(fit.next());
      }
      break;
    }

    case NOT: {
      collectBoundVariables(formula->uarg());
      break;
    }

    case IMP:
    case IFF:
    case XOR: {
      collectBoundVariables(formula->left());
      collectBoundVariables(formula->right());
      break;
    }

    case BOOL_TERM: {
      collectBoundVariables(formula->getBooleanTerm());
      break;
    }

    case LITERAL: {
      collectBoundVariables(formula->literal());
      break;
    }

    default:
      break;
  }
}